

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O0

Vec_Ptr_t *
Aig_ManPartSplit(Aig_Man_t *p,Vec_Int_t *vNode2Part,Vec_Ptr_t **pvPio2Id,Vec_Ptr_t **pvPart2Pos)

{
  Vec_Ptr_t *p_00;
  Vec_Ptr_t **p_01;
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Man_t *Entry;
  Aig_Obj_t *pAVar4;
  int nParts;
  int nodePart;
  int i;
  Aig_Obj_t *pDriver;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAig;
  Vec_Int_t *vPio2IdOne;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vPio2Id;
  Vec_Ptr_t *vAigs;
  Vec_Vec_t *vPart2Pos;
  Vec_Vec_t *vGroups;
  Vec_Ptr_t **pvPart2Pos_local;
  Vec_Ptr_t **pvPio2Id_local;
  Vec_Int_t *vNode2Part_local;
  Aig_Man_t *p_local;
  
  vGroups = (Vec_Vec_t *)pvPart2Pos;
  pvPart2Pos_local = pvPio2Id;
  pvPio2Id_local = (Vec_Ptr_t **)vNode2Part;
  vNode2Part_local = (Vec_Int_t *)p;
  vPio2Id = Vec_PtrAlloc(100);
  vNodes = Vec_PtrAlloc(100);
  iVar1 = Vec_IntFindMax((Vec_Int_t *)pvPio2Id_local);
  if (0 < iVar1 + 1) {
    vPart2Pos = Vec_VecAlloc(iVar1 + 1);
    for (nParts = 0; iVar1 = Vec_IntSize((Vec_Int_t *)pvPio2Id_local), nParts < iVar1;
        nParts = nParts + 1) {
      iVar1 = Vec_IntEntry((Vec_Int_t *)pvPio2Id_local,nParts);
      pAVar3 = Aig_ManObj((Aig_Man_t *)vNode2Part_local,nParts);
      iVar2 = Aig_ObjIsNode(pAVar3);
      if (iVar2 != 0) {
        Vec_VecPush(vPart2Pos,iVar1,pAVar3);
      }
    }
    for (nParts = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)vNode2Part_local[1].pArray), nParts < iVar1;
        nParts = nParts + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vNode2Part_local[1].pArray,nParts);
      pAVar4 = Aig_ObjFanin0(pAVar3);
      iVar1 = Aig_ObjIsCi(pAVar4);
      if (iVar1 != 0) {
        iVar1 = Aig_ObjFaninC0(pAVar3);
        if (iVar1 == 0) {
          *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffdf | 0x20;
        }
        else {
          *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffef | 0x10;
        }
      }
    }
    for (nParts = 0; iVar1 = Vec_VecSize(vPart2Pos), nParts < iVar1; nParts = nParts + 1) {
      vPio2IdOne = (Vec_Int_t *)Vec_VecEntry(vPart2Pos,nParts);
      iVar1 = Vec_PtrSize((Vec_Ptr_t *)vPio2IdOne);
      if (iVar1 == 0) {
        printf("Aig_ManPartSplit(): Skipping partition # %d without nodes (warning).\n",
               (ulong)(uint)nParts);
      }
      else {
        Entry = Aig_ManPartSplitOne((Aig_Man_t *)vNode2Part_local,(Vec_Ptr_t *)vPio2IdOne,
                                    (Vec_Int_t **)&pAig);
        Vec_PtrPush(vNodes,pAig);
        Vec_PtrPush(vPio2Id,Entry);
      }
    }
    Vec_VecFree(vPart2Pos);
    iVar1 = Vec_PtrSize(vPio2Id);
    vAigs = (Vec_Ptr_t *)Vec_VecStart(iVar1);
    for (nParts = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)vNode2Part_local[1].pArray), nParts < iVar1;
        nParts = nParts + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vNode2Part_local[1].pArray,nParts);
      pAVar4 = Aig_ObjFanin0(pAVar3);
      iVar1 = Aig_ObjIsCi(pAVar4);
      p_01 = pvPio2Id_local;
      p_00 = vAigs;
      if (iVar1 == 0) {
        iVar1 = Aig_ObjFaninId0(pAVar3);
        iVar1 = Vec_IntEntry((Vec_Int_t *)p_01,iVar1);
        Vec_VecPush((Vec_Vec_t *)p_00,iVar1,pAVar3);
      }
      else {
        *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffdf;
        *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffef;
      }
    }
    *pvPart2Pos_local = vNodes;
    *(Vec_Ptr_t **)vGroups = vAigs;
    return vPio2Id;
  }
  __assert_fail("nParts > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                ,0xed,
                "Vec_Ptr_t *Aig_ManPartSplit(Aig_Man_t *, Vec_Int_t *, Vec_Ptr_t **, Vec_Ptr_t **)")
  ;
}

Assistant:

Vec_Ptr_t * Aig_ManPartSplit( Aig_Man_t * p, Vec_Int_t * vNode2Part, Vec_Ptr_t ** pvPio2Id, Vec_Ptr_t ** pvPart2Pos )
{
    Vec_Vec_t * vGroups, * vPart2Pos;
    Vec_Ptr_t * vAigs, * vPio2Id, * vNodes;
    Vec_Int_t * vPio2IdOne;
    Aig_Man_t * pAig;
    Aig_Obj_t * pObj, * pDriver;
    int i, nodePart, nParts;
    vAigs = Vec_PtrAlloc( 100 );
    vPio2Id = Vec_PtrAlloc( 100 );
    // put all nodes into levels according to their partition
    nParts = Vec_IntFindMax(vNode2Part) + 1;
    assert( nParts > 0 );
    vGroups = Vec_VecAlloc( nParts );
    Vec_IntForEachEntry( vNode2Part, nodePart, i )
    {
        pObj = Aig_ManObj( p, i );
        if ( Aig_ObjIsNode(pObj) )
            Vec_VecPush( vGroups, nodePart, pObj );
    }

    // label PIs that should be restricted to some values
    Aig_ManForEachCo( p, pObj, i )
    {
        pDriver = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsCi(pDriver) )
        {
            if ( Aig_ObjFaninC0(pObj) )
                pDriver->fMarkA = 1; // const0 PI
            else
                pDriver->fMarkB = 1; // const1 PI
        }
    }

    // create partitions
    Vec_VecForEachLevel( vGroups, vNodes, i )
    {
        if ( Vec_PtrSize(vNodes) == 0 )
        {
            printf( "Aig_ManPartSplit(): Skipping partition # %d without nodes (warning).\n", i );
            continue;
        }
        pAig = Aig_ManPartSplitOne( p, vNodes, &vPio2IdOne );
        Vec_PtrPush( vPio2Id, vPio2IdOne );
        Vec_PtrPush( vAigs, pAig );
    }
    Vec_VecFree( vGroups );

    // divide POs according to their partitions
    vPart2Pos = Vec_VecStart( Vec_PtrSize(vAigs) );
    Aig_ManForEachCo( p, pObj, i )
    {
        pDriver = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsCi(pDriver) )
            pDriver->fMarkA = pDriver->fMarkB = 0;
        else
            Vec_VecPush( vPart2Pos, Vec_IntEntry(vNode2Part, Aig_ObjFaninId0(pObj)), pObj );
    }

    *pvPio2Id = vPio2Id;
    *pvPart2Pos = (Vec_Ptr_t *)vPart2Pos;
    return vAigs;
}